

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O1

void qt_format_text(QFont *fnt,QRectF *_r,int tf,QTextOption *option,QString *str,QRectF *brect,
                   int tabstops,int *ta,int tabarraylen,QPainter *painter)

{
  QTextFormat *this;
  char16_t cVar1;
  __uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_> _Var2;
  undefined1 auVar3 [16];
  QTextLayout this_00;
  byte bVar4;
  char cVar5;
  QFixed QVar6;
  pointer pQVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  char16_t *pcVar11;
  char16_t *pcVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  byte bVar17;
  int iVar18;
  byte bVar19;
  int iVar20;
  long in_FS_OFFSET;
  bool bVar21;
  qreal qVar22;
  double dVar23;
  qreal qVar24;
  QTextLine QVar25;
  QFontMetricsF fm;
  QStackTextEngine engine;
  int local_2b64;
  qreal local_2b60;
  int local_2b50;
  double local_2b48;
  double local_2b38;
  QPointF local_2ac8;
  QTextLine local_2ab8;
  QTextLayout local_2aa0;
  QString local_2a98;
  QArrayDataPointer<QTextLayout::FormatRange> local_2a78;
  QArrayData *local_2a58;
  char16_t *pcStack_2a50;
  long local_2a48;
  QFontMetricsF local_2a40;
  undefined1 local_2a38 [24];
  double dStack_2a20;
  QList<double> local_2a10;
  undefined1 local_29f8 [16];
  undefined1 local_29e8 [24];
  QStackTextEngine local_29d0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((uint)tf >> 9 & 1) == 0) && (_r->h <= 0.0 || _r->w <= 0.0)) {
    if (brect == (QRectF *)0x0) goto LAB_003de95c;
    tf = tf | 0x4000;
  }
  if (option != (QTextOption *)0x0) {
    uVar8 = *(uint *)option & 0x1ff | tf;
    uVar14 = uVar8 | 0x1000;
    if ((*(uint *)option & 0x1e00) == 0) {
      uVar14 = uVar8;
    }
    bVar21 = true;
    if (option->tab < 0.0) {
      QTextOption::tabArray(&local_2a10,option);
      bVar21 = local_2a10.d.size != 0;
      if (&(local_2a10.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_2a10.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_2a10.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_2a10.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_2a10.d.d)->super_QArrayData,8,0x10);
        }
      }
    }
    tf = uVar14 | 0x400;
    if (!bVar21) {
      tf = uVar14;
    }
  }
  local_2a38._0_8_ = _r->xp;
  local_2a38._8_8_ = _r->yp;
  local_2a38._16_8_ = _r->w;
  dStack_2a20 = _r->h;
  uVar14 = 0;
  if ((((uint)tf >> 0x11 & 1) == 0) && (uVar14 = 1, ((uint)tf >> 0x12 & 1) == 0)) {
    if (option == (QTextOption *)0x0) {
      uVar14 = 0;
      if (painter != (QPainter *)0x0) {
        _Var2._M_t.super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
        super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl =
             *(tuple<QPainterState_*,_std::default_delete<QPainterState>_> *)
              &(((painter->d_ptr)._M_t.
                 super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                 super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl)->state)._M_t;
        if ((__uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>)
            _Var2._M_t.super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
            super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>)0x0) {
          uVar14 = 2;
        }
        else {
          uVar14 = *(uint *)((long)_Var2._M_t.
                                   super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                                   .super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl +
                            0x1b0);
        }
      }
    }
    else {
      uVar14 = *(uint *)option >> 0xe & 3;
    }
  }
  uVar10 = (uint)((tf & 0x1fU) == 0);
  uVar9 = uVar10 | tf;
  uVar8 = uVar9 ^ 3;
  if (uVar14 != 1) {
    uVar8 = uVar9;
  }
  if (uVar10 == 0 && (tf & 3U) == 0) {
    uVar8 = uVar9;
  }
  if ((tf & 0x10U) != 0) {
    uVar8 = uVar9;
  }
  if ((uVar8 >> 10 & 1) == 0) {
    bVar17 = 0;
  }
  else if ((uVar14 == 1) || (bVar17 = 1, (uVar8 & 1) == 0)) {
    bVar17 = (byte)((uVar8 & 2) >> 1) & uVar14 == 1;
  }
  uVar9 = uVar8 | 0x4000;
  if (painter != (QPainter *)0x0) {
    uVar9 = uVar8;
  }
  local_2a40.d.d.ptr = (QExplicitlySharedDataPointer<QFontPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QFontMetricsF::QFontMetricsF(&local_2a40,fnt);
  local_2a58 = &((str->d).d)->super_QArrayData;
  pcStack_2a50 = (str->d).ptr;
  local_2a48 = (str->d).size;
  if (local_2a58 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_2a58->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_2a58->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_2b64 = tabstops;
  uVar14 = (uVar14 & 3) << 0xe;
  local_2b50 = 0;
  iVar20 = 0;
  do {
    lVar16 = (long)iVar20;
    iVar18 = iVar20;
    if (lVar16 < local_2a48) {
      bVar19 = 0;
      do {
        cVar1 = pcStack_2a50[lVar16];
        if (cVar1 == L'\r') {
LAB_003ddefa:
          if ((local_2a58 == (QArrayData *)0x0) ||
             (1 < (((QArrayData *)&local_2a58->ref_)->ref_)._q_value.super___atomic_base<int>._M_i))
          {
            QString::reallocData((longlong)&local_2a58,(AllocationOption)local_2a48);
          }
          pcStack_2a50[lVar16] = L' ';
LAB_003ddf2e:
          bVar21 = true;
        }
        else {
          if (((uint)tf >> 8 & 1) != 0) {
            if (cVar1 == L'\t') goto LAB_003ddfd2;
            if (cVar1 == L'&') goto LAB_003ddfc9;
            if (cVar1 != L'\n') goto LAB_003ddfaf;
            goto LAB_003ddefa;
          }
          if (cVar1 != L'\t') {
            if (cVar1 == L'&') {
LAB_003ddfc9:
              local_2b50 = local_2b50 + 1;
            }
            else {
              if (cVar1 != L'\n') {
LAB_003ddfaf:
                bVar21 = cVar1 != L'\x9c';
                if (!bVar21) {
                  bVar19 = 1;
                }
                goto LAB_003ddf30;
              }
              if ((local_2a58 == (QArrayData *)0x0) ||
                 (1 < (((QArrayData *)&local_2a58->ref_)->ref_)._q_value.super___atomic_base<int>.
                      _M_i)) {
                QString::reallocData((longlong)&local_2a58,(AllocationOption)local_2a48);
              }
              pcStack_2a50[lVar16] = L'\x2028';
            }
            goto LAB_003ddf2e;
          }
LAB_003ddfd2:
          if (bVar17 == 0) goto LAB_003ddefa;
          bVar21 = true;
          if (tabarraylen == 0 && local_2b64 == 0) {
            qVar24 = QFontMetricsF::horizontalAdvance(&local_2a40,(QChar)0x78);
            local_2b64 = (int)((double)((ulong)(qVar24 * 8.0) & 0x8000000000000000 |
                                       0x3fe0000000000000) + qVar24 * 8.0);
          }
        }
LAB_003ddf30:
        if (!bVar21) break;
        lVar16 = lVar16 + 1;
        iVar18 = iVar18 + 1;
      } while (lVar16 < local_2a48);
    }
    else {
      bVar19 = 0;
    }
    iVar15 = iVar18 - iVar20;
    local_2a78.d = (Data *)0x0;
    local_2a78.ptr = (FormatRange *)0x0;
    local_2a78.size = 0;
    if ((tf & 0x8000U) == 0) {
      if (((byte)((uint)tf >> 0xb) & local_2b50 != 0) != 0) {
LAB_003de094:
        if ((local_2a58 == (QArrayData *)0x0) ||
           (1 < (((QArrayData *)&local_2a58->ref_)->ref_)._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData((longlong)&local_2a58,(AllocationOption)local_2a48);
        }
        if (iVar15 != 0) {
          pcVar11 = pcStack_2a50 + iVar20;
          lVar16 = 0;
          pcVar12 = pcVar11;
          do {
            if (*pcVar12 == L'&') {
              iVar15 = iVar15 + -1;
              if (iVar15 == 0) break;
              pcVar12 = pcVar12 + 1;
              if (((uVar9 & 0x4000) == 0 && (tf & 0x8000U) == 0) && (*pcVar12 != L'&')) {
                local_29e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_29f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_29f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                this = (QTextFormat *)(local_29f8 + 8);
                QTextCharFormat::QTextCharFormat((QTextCharFormat *)this);
                local_29f8._4_4_ = 1;
                local_29f8._0_4_ = (int)lVar16;
                QVariant::QVariant((QVariant *)&local_29d0,1);
                QTextFormat::setProperty(this,0x2023,(QVariant *)&local_29d0);
                QVariant::~QVariant((QVariant *)&local_29d0);
                QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::
                emplace<QTextLayout::FormatRange_const&>
                          ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_2a78,local_2a78.size
                           ,(FormatRange *)local_29f8);
                QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_2a78)
                ;
                QTextFormat::~QTextFormat(this);
              }
            }
            pcVar11[lVar16] = *pcVar12;
            pcVar12 = pcVar12 + 1;
            lVar16 = lVar16 + 1;
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
        }
      }
    }
    else if (local_2b50 != 0) goto LAB_003de094;
    local_2a98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_2a98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_2a98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::mid((longlong)&local_2a98,(longlong)&local_2a58);
    QStackTextEngine::QStackTextEngine(&local_29d0,&local_2a98,fnt);
    if (option != (QTextOption *)0x0) {
      QTextOption::operator=(&local_29d0.super_QTextEngine.option,option);
    }
    if ((local_29d0.super_QTextEngine.option.tab < 0.0) && (0 < local_2b64)) {
      local_29d0.super_QTextEngine.option.tab = (qreal)local_2b64;
    }
    QTextOption::tabs((QList<QTextOption::Tab> *)local_29f8,&local_29d0.super_QTextEngine.option);
    bVar21 = local_29e8._0_8_ == 0;
    if ((QArrayData *)local_29f8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_29f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_29f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_29f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_29f8._0_8_,0x10,0x10);
      }
    }
    if (ta != (int *)0x0 && bVar21) {
      local_29f8._0_8_ = (QArrayData *)0x0;
      local_29f8._8_8_ = (QTextFormatPrivate *)0x0;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_29e8._8_8_;
      local_29e8._0_16_ = auVar3 << 0x40;
      QList<double>::reserve((QList<double> *)local_29f8,(long)tabarraylen);
      if (0 < tabarraylen) {
        uVar13 = 0;
        do {
          local_2ab8._0_8_ = (BADTYPE)ta[uVar13];
          QtPrivate::QPodArrayOps<double>::emplace<double&>
                    ((QPodArrayOps<double> *)local_29f8,local_29e8._0_8_,(double *)&local_2ab8);
          QList<double>::end((QList<double> *)local_29f8);
          uVar13 = uVar13 + 1;
        } while ((uint)tabarraylen != uVar13);
      }
      QTextOption::setTabArray(&local_29d0.super_QTextEngine.option,(QList<double> *)local_29f8);
      if ((QArrayData *)local_29f8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_29f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_29f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_29f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_29f8._0_8_,8,0x10);
        }
      }
    }
    uVar8 = 8;
    if ((uVar9 & 8) == 0) {
      uVar8 = 1;
    }
    uVar10 = uVar8 | local_29d0.super_QTextEngine.option._0_4_ & 0xffff3e00 | uVar14;
    if ((option == (QTextOption *)0x0) && ((uVar9 & 0x2000) != 0)) {
      uVar10 = uVar8 | local_29d0.super_QTextEngine.option._0_4_ & 0xffff2000 | uVar14 | 0x600;
    }
    local_29d0.super_QTextEngine.option._0_4_ = uVar10;
    if ((uVar9 & 0x10000) != 0) {
      local_29d0.super_QTextEngine._168_1_ = local_29d0.super_QTextEngine._168_1_ | 8;
    }
    local_2aa0.d = &local_29d0.super_QTextEngine;
    QTextLayout::setCacheEnabled(&local_2aa0,true);
    QTextLayout::setFormats(&local_2aa0,(QList<QTextLayout::FormatRange> *)&local_2a78);
    if ((undefined1 *)local_2a98.d.size == (undefined1 *)0x0) {
      local_2b38 = QFontMetricsF::height(&local_2a40);
      uVar9 = uVar9 | 0x4000;
      qVar24 = 0.0;
    }
    else {
      local_2b60 = 16777216.0;
      if (((uVar9 & 0x10000) != 0 || (tf & 0x3000U) != 0) &&
         (local_2b60 = (qreal)local_2a38._16_8_, (double)local_2a38._16_8_ <= 0.0)) {
        local_2b60 = 0.0;
      }
      QTextLayout::beginLayout(&local_2aa0);
      qVar22 = QFontMetricsF::leading(&local_2a40);
      local_2b38 = -qVar22;
      local_2b48 = 0.0;
      do {
        local_29f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_29f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QVar25 = QTextLayout::createLine(&local_2aa0);
        local_29f8._8_8_ = QVar25.eng;
        local_29f8._0_4_ = QVar25.index;
        if ((QTextEngine *)local_29f8._8_8_ == (QTextEngine *)0x0) {
          bVar4 = 0;
          qVar24 = local_2b48;
        }
        else {
          QTextLine::setLineWidth((QTextLine *)local_29f8,local_2b60);
          dVar23 = ceil(local_2b38 + qVar22);
          local_2ab8._0_8_ = (undefined1 *)0x0;
          local_2ab8.eng = (QTextEngine *)(double)(int)dVar23;
          QTextLine::setPosition((QTextLine *)local_29f8,(QPointF *)&local_2ab8);
          lVar16 = (long)(int)local_29f8._0_4_;
          pQVar7 = QList<QScriptLine>::data(&(local_2aa0.d)->lines);
          uVar8 = pQVar7[lVar16].leading.val;
          if ((int)uVar8 < 1) {
            uVar8 = 0;
          }
          local_2b38 = (double)(int)((*(int *)&pQVar7[lVar16].field_0x28 >> 0x1f & uVar8) +
                                    pQVar7[lVar16].ascent.val + pQVar7[lVar16].descent.val) *
                       0.015625 + (double)(int)dVar23;
          qVar24 = QTextLine::naturalTextWidth((QTextLine *)local_29f8);
          if (qVar24 <= local_2b48) {
            qVar24 = local_2b48;
          }
          bVar4 = local_2b38 < dStack_2a20 | brect != (QRectF *)0x0 | (byte)((uint)tf >> 9) & 1;
        }
        local_2b48 = qVar24;
      } while (bVar4 != 0);
      QTextLayout::endLayout(&local_2aa0);
    }
    if ((uVar9 & 0x40) == 0) {
      local_2b48 = 0.0;
      if ((char)uVar9 < '\0') {
        local_2b48 = (dStack_2a20 - local_2b38) * 0.5;
      }
    }
    else {
      local_2b48 = dStack_2a20 - local_2b38;
    }
    if ((uVar9 & 2) == 0) {
      dVar23 = 0.0;
      if ((uVar9 & 4) != 0) {
        dVar23 = ((double)local_2a38._16_8_ - qVar24) * 0.5;
      }
    }
    else {
      dVar23 = (double)local_2a38._16_8_ - qVar24;
    }
    local_29f8._0_8_ = dVar23 + (double)local_2a38._0_8_;
    local_29f8._8_8_ = local_2b48 + (double)local_2a38._8_8_;
    local_29e8._8_8_ = local_2b38;
    local_29e8._0_8_ = qVar24;
    if ((((~bVar19 | (byte)(uVar9 >> 0x13)) & 1) == 0) &&
       (cVar5 = QRectF::contains((QRectF *)local_2a38), cVar5 == '\0')) {
      iVar20 = iVar18 + 1;
      bVar21 = true;
    }
    else {
      if (brect != (QRectF *)0x0) {
        brect->w = (qreal)local_29e8._0_8_;
        brect->h = (qreal)local_29e8._8_8_;
        brect->xp = (qreal)local_29f8._0_8_;
        brect->yp = (qreal)local_29f8._8_8_;
      }
      iVar20 = iVar18;
      if ((uVar9 >> 0xe & 1) == 0) {
        if (((uint)tf >> 9 & 1) == 0) {
          cVar5 = QRectF::contains((QRectF *)local_2a38);
          if (cVar5 != '\0') goto LAB_003de746;
          QPainter::save(painter);
          QPainter::setClipRect(painter,(QRectF *)local_2a38,IntersectClip);
          bVar21 = true;
        }
        else {
LAB_003de746:
          bVar21 = false;
        }
        iVar18 = QTextLayout::lineCount(&local_2aa0);
        if (0 < iVar18) {
          iVar18 = 0;
          do {
            local_2ab8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_2ab8.eng = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
            QVar25 = QTextLayout::lineAt(&local_2aa0,iVar18);
            this_00.d = local_2aa0.d;
            local_2ab8.eng = QVar25.eng;
            local_2ab8.index = QVar25.index;
            (local_2aa0.d)->field_0xa8 = (local_2aa0.d)->field_0xa8 | 0x20;
            qVar24 = QTextLine::horizontalAdvance(&local_2ab8);
            if ((uVar9 & 2) == 0) {
              dVar23 = 0.0;
              if ((uVar9 & 4) != 0) {
                dVar23 = ((double)local_2a38._16_8_ - qVar24) * 0.5;
              }
            }
            else {
              dVar23 = (double)local_2a38._16_8_ - qVar24;
              lVar16 = (long)local_2ab8.index;
              pQVar7 = QList<QScriptLine>::data(&(this_00.d)->lines);
              QVar6 = QTextEngine::leadingSpaceWidth(this_00.d,pQVar7 + lVar16);
              dVar23 = (double)QVar6.val * -0.015625 + dVar23;
            }
            local_2ac8.xp = dVar23 + (double)local_2a38._0_8_;
            local_2ac8.yp = local_2b48 + (double)local_2a38._8_8_;
            QTextLine::draw(&local_2ab8,painter,&local_2ac8);
            QTextEngine::drawDecorations(this_00.d,painter);
            iVar18 = iVar18 + 1;
            iVar15 = QTextLayout::lineCount(&local_2aa0);
          } while (iVar18 < iVar15);
        }
        if (bVar21) {
          QPainter::restore(painter);
        }
        bVar21 = false;
      }
      else {
        bVar21 = false;
      }
    }
    QTextLayout::~QTextLayout(&local_2aa0);
    QTextEngine::LayoutData::~LayoutData(&local_29d0._layoutData);
    QTextEngine::~QTextEngine(&local_29d0.super_QTextEngine);
    if (&(local_2a98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2a98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2a98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_2a98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_2a98.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer(&local_2a78);
  } while (bVar21);
  if (local_2a58 != (QArrayData *)0x0) {
    LOCK();
    (local_2a58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_2a58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_2a58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_2a58,2,0x10);
    }
  }
  QFontMetricsF::~QFontMetricsF(&local_2a40);
LAB_003de95c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qt_format_text(const QFont &fnt, const QRectF &_r,
                    int tf, const QTextOption *option, const QString& str, QRectF *brect,
                    int tabstops, int *ta, int tabarraylen,
                    QPainter *painter)
{

    Q_ASSERT( !((tf & ~Qt::TextDontPrint)!=0 && option!=nullptr) ); // we either have an option or flags

    if (_r.isEmpty() && !(tf & Qt::TextDontClip)) {
        if (!brect)
            return;
        else
            tf |= Qt::TextDontPrint;
    }

    if (option) {
        tf |= option->alignment();
        if (option->wrapMode() != QTextOption::NoWrap)
            tf |= Qt::TextWordWrap;

        if (option->flags() & QTextOption::IncludeTrailingSpaces)
            tf |= Qt::TextIncludeTrailingSpaces;

        if (option->tabStopDistance() >= 0 || !option->tabArray().isEmpty())
            tf |= Qt::TextExpandTabs;
    }

    // we need to copy r here to protect against the case (&r == brect).
    QRectF r(_r);

    bool dontclip  = (tf & Qt::TextDontClip);
    bool wordwrap  = (tf & Qt::TextWordWrap) || (tf & Qt::TextWrapAnywhere);
    bool singleline = (tf & Qt::TextSingleLine);
    bool showmnemonic = (tf & Qt::TextShowMnemonic);
    bool hidemnmemonic = (tf & Qt::TextHideMnemonic);

    Qt::LayoutDirection layout_direction;
    if (tf & Qt::TextForceLeftToRight)
        layout_direction = Qt::LeftToRight;
    else if (tf & Qt::TextForceRightToLeft)
        layout_direction = Qt::RightToLeft;
    else if (option)
        layout_direction = option->textDirection();
    else if (painter)
        layout_direction = painter->layoutDirection();
    else
        layout_direction = Qt::LeftToRight;

    tf = QGuiApplicationPrivate::visualAlignment(layout_direction, QFlag(tf));

    bool isRightToLeft = layout_direction == Qt::RightToLeft;
    bool expandtabs = ((tf & Qt::TextExpandTabs) &&
                        (((tf & Qt::AlignLeft) && !isRightToLeft) ||
                          ((tf & Qt::AlignRight) && isRightToLeft)));

    if (!painter)
        tf |= Qt::TextDontPrint;

    uint maxUnderlines = 0;

    QFontMetricsF fm(fnt);
    QString text = str;
    int offset = 0;
start_lengthVariant:
    bool hasMoreLengthVariants = false;
    // compatible behaviour to the old implementation. Replace
    // tabs by spaces
    int old_offset = offset;
    for (; offset < text.size(); offset++) {
        QChar chr = text.at(offset);
        if (chr == u'\r' || (singleline && chr == u'\n')) {
            text[offset] = u' ';
        } else if (chr == u'\n') {
            text[offset] = QChar::LineSeparator;
        } else if (chr == u'&') {
            ++maxUnderlines;
        } else if (chr == u'\t') {
            if (!expandtabs) {
                text[offset] = u' ';
            } else if (!tabarraylen && !tabstops) {
                tabstops = qRound(fm.horizontalAdvance(u'x')*8);
            }
        } else if (chr == u'\x9c') {
            // string with multiple length variants
            hasMoreLengthVariants = true;
            break;
        }
    }

    QList<QTextLayout::FormatRange> underlineFormats;
    int length = offset - old_offset;
    if ((hidemnmemonic || showmnemonic) && maxUnderlines > 0) {
        QChar *cout = text.data() + old_offset;
        QChar *cout0 = cout;
        QChar *cin = cout;
        int l = length;
        while (l) {
            if (*cin == u'&') {
                ++cin;
                --length;
                --l;
                if (!l)
                    break;
                if (*cin != u'&' && !hidemnmemonic && !(tf & Qt::TextDontPrint)) {
                    QTextLayout::FormatRange range;
                    range.start = cout - cout0;
                    range.length = 1;
                    range.format.setFontUnderline(true);
                    underlineFormats.append(range);
                }
#ifdef Q_OS_MAC
            } else if (hidemnmemonic && *cin == u'(' && l >= 4 &&
                       cin[1] == u'&' && cin[2] != u'&' &&
                       cin[3] == u')') {
                int n = 0;
                while ((cout - n) > cout0 && (cout - n - 1)->isSpace())
                    ++n;
                cout -= n;
                cin += 4;
                length -= n + 4;
                l -= 4;
                continue;
#endif //Q_OS_MAC
            }
            *cout = *cin;
            ++cout;
            ++cin;
            --l;
        }
    }

    qreal height = 0;
    qreal width = 0;

    QString finalText = text.mid(old_offset, length);
    Q_DECL_UNINITIALIZED QStackTextEngine engine(finalText, fnt);
    if (option) {
        engine.option = *option;
    }

    if (engine.option.tabStopDistance() < 0 && tabstops > 0)
        engine.option.setTabStopDistance(tabstops);

    if (engine.option.tabs().isEmpty() && ta) {
        QList<qreal> tabs;
        tabs.reserve(tabarraylen);
        for (int i = 0; i < tabarraylen; i++)
            tabs.append(qreal(ta[i]));
        engine.option.setTabArray(tabs);
    }

    engine.option.setTextDirection(layout_direction);
    if (tf & Qt::AlignJustify)
        engine.option.setAlignment(Qt::AlignJustify);
    else
        engine.option.setAlignment(Qt::AlignLeft); // do not do alignment twice

    if (!option && (tf & Qt::TextWrapAnywhere))
        engine.option.setWrapMode(QTextOption::WrapAnywhere);

    if (tf & Qt::TextJustificationForced)
        engine.forceJustification = true;
    QTextLayout textLayout(&engine);
    textLayout.setCacheEnabled(true);
    textLayout.setFormats(underlineFormats);

    if (finalText.isEmpty()) {
        height = fm.height();
        width = 0;
        tf |= Qt::TextDontPrint;
    } else {
        qreal lineWidth = 0x01000000;
        if (wordwrap || (tf & Qt::TextJustificationForced))
            lineWidth = qMax<qreal>(0, r.width());
        if (!wordwrap)
            tf |= Qt::TextIncludeTrailingSpaces;
        textLayout.beginLayout();

        qreal leading = fm.leading();
        height = -leading;

        while (1) {
            QTextLine l = textLayout.createLine();
            if (!l.isValid())
                break;

            l.setLineWidth(lineWidth);
            height += leading;

            // Make sure lines are positioned on whole pixels
            height = qCeil(height);
            l.setPosition(QPointF(0., height));
            height += textLayout.engine()->lines[l.lineNumber()].height().toReal();
            width = qMax(width, l.naturalTextWidth());
            if (!dontclip && !brect && height >= r.height())
                break;
        }
        textLayout.endLayout();
    }

    qreal yoff = 0;
    qreal xoff = 0;
    if (tf & Qt::AlignBottom)
        yoff = r.height() - height;
    else if (tf & Qt::AlignVCenter)
        yoff = (r.height() - height)/2;

    if (tf & Qt::AlignRight)
        xoff = r.width() - width;
    else if (tf & Qt::AlignHCenter)
        xoff = (r.width() - width)/2;

    QRectF bounds = QRectF(r.x() + xoff, r.y() + yoff, width, height);

    if (hasMoreLengthVariants && !(tf & Qt::TextLongestVariant) && !r.contains(bounds)) {
        offset++;
        goto start_lengthVariant;
    }
    if (brect)
        *brect = bounds;

    if (!(tf & Qt::TextDontPrint)) {
        bool restore = false;
        if (!dontclip && !r.contains(bounds)) {
            restore = true;
            painter->save();
            painter->setClipRect(r, Qt::IntersectClip);
        }

        for (int i = 0; i < textLayout.lineCount(); i++) {
            QTextLine line = textLayout.lineAt(i);
            QTextEngine *eng = textLayout.engine();
            eng->enableDelayDecorations();

            qreal advance = line.horizontalAdvance();
            xoff = 0;
            if (tf & Qt::AlignRight) {
                xoff = r.width() - advance -
                    eng->leadingSpaceWidth(eng->lines[line.lineNumber()]).toReal();
            }
            else if (tf & Qt::AlignHCenter)
                xoff = (r.width() - advance) / 2;

            line.draw(painter, QPointF(r.x() + xoff, r.y() + yoff));
            eng->drawDecorations(painter);
        }

        if (restore) {
            painter->restore();
        }
    }
}